

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValid_Pipeline(void)

{
  Result *this;
  NeuralNetwork *pNVar1;
  Model *m;
  Pipeline *input;
  bool bVar2;
  ostream *poVar3;
  char *output;
  ArenaStringPtr *pAVar4;
  Arena *pAVar5;
  ModelDescription *this_00;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  RepeatedField<long> *pRVar6;
  FeatureType *this_02;
  Result local_330;
  set<long,_std::less<long>,_std::allocator<long>_> local_308;
  set<long,_std::less<long>,_std::allocator<long>_> local_2d8;
  set<long,_std::less<long>,_std::allocator<long>_> local_2a8;
  ArrayFeatureType *local_270;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInput;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  string local_240 [8];
  string targetName;
  string local_218 [8];
  string softmaxOutputName;
  Result local_1d0;
  Result local_1a8;
  Result local_180;
  undefined4 local_154;
  Result local_150;
  NeuralNetwork *local_128;
  NeuralNetwork *neuralNet;
  Model *m4;
  Model *m3;
  Model *m2;
  Model *m1;
  Pipeline *pipeline;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  undefined1 local_a8 [8];
  Result res;
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::Result((Result *)local_a8);
  tensorAttributesB._8_8_ = anon_var_dwarf_343ef;
  tensorAttributesC._8_8_ = (long)"RGB" + 2;
  tensorAttributesB.name = (char *)0x1;
  tensorAttributesD._8_8_ = (long)"LOC" + 2;
  tensorAttributesC.name = (char *)0x1;
  pipeline = (Pipeline *)0x585a87;
  tensorAttributesD.name = (char *)0x3;
  m1 = (Model *)buildEmptyPipelineModelWithStringOutput
                          ((Model *)((long)&res.m_message.field_2 + 8),true,
                           (TensorAttributes *)&tensorAttributesB.dimension,"E");
  CoreML::Specification::Model::set_specificationversion
            ((Model *)((long)&res.m_message.field_2 + 8),4);
  m2 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  m3 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  m4 = CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  neuralNet = (NeuralNetwork *)CoreML::Specification::Pipeline::add_models((Pipeline *)m1);
  buildBasicNeuralNetworkModel
            (m2,false,(TensorAttributes *)&tensorAttributesB.dimension,
             (TensorAttributes *)&tensorAttributesC.dimension,1,false,false);
  buildBasicNeuralNetworkModel
            (m3,false,(TensorAttributes *)&tensorAttributesC.dimension,
             (TensorAttributes *)&tensorAttributesD.dimension,1,false,false);
  local_128 = buildBasicNeuralNetworkModel
                        (m4,true,(TensorAttributes *)&tensorAttributesD.dimension,
                         (TensorAttributes *)&pipeline,1,false,false);
  buildBasicNearestNeighborClassifier((Model *)neuralNet,false,(TensorAttributes *)&pipeline,"E");
  CoreML::Model::validate(&local_150,m2);
  CoreML::Result::operator=((Result *)local_a8,&local_150);
  CoreML::Result::~Result(&local_150);
  bVar2 = CoreML::Result::good((Result *)local_a8);
  if (bVar2) {
    CoreML::Model::validate(&local_180,m3);
    CoreML::Result::operator=((Result *)local_a8,&local_180);
    CoreML::Result::~Result(&local_180);
    bVar2 = CoreML::Result::good((Result *)local_a8);
    if (bVar2) {
      CoreML::Model::validate(&local_1a8,m4);
      CoreML::Result::operator=((Result *)local_a8,&local_1a8);
      CoreML::Result::~Result(&local_1a8);
      bVar2 = CoreML::Result::good((Result *)local_a8);
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x987);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"!((res).good())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        spec._oneof_case_[0] = 1;
        local_154 = 1;
      }
      else {
        CoreML::Model::validate(&local_1d0,(Model *)neuralNet);
        CoreML::Result::operator=((Result *)local_a8,&local_1d0);
        CoreML::Result::~Result(&local_1d0);
        bVar2 = CoreML::Result::good((Result *)local_a8);
        if (bVar2) {
          CoreML::Model::validate
                    ((Result *)((long)&softmaxOutputName.field_2 + 8),
                     (Model *)((long)&res.m_message.field_2 + 8));
          this = (Result *)((long)&softmaxOutputName.field_2 + 8);
          CoreML::Result::operator=((Result *)local_a8,this);
          CoreML::Result::~Result(this);
          bVar2 = CoreML::Result::good((Result *)local_a8);
          if (bVar2) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                    );
            poVar3 = std::operator<<(poVar3,":");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98e);
            poVar3 = std::operator<<(poVar3,": error: ");
            poVar3 = std::operator<<(poVar3,"!((res).good())");
            poVar3 = std::operator<<(poVar3," was false, expected true.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            spec._oneof_case_[0] = 1;
            local_154 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_218,"softmax_out",
                       (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_240,"cce_target",(allocator<char> *)((long)&updateParams + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&updateParams + 7));
            input = pipeline;
            m = m4;
            output = (char *)std::__cxx11::string::c_str();
            addSoftmaxLayer(m,"softmax",(char *)input,output);
            lossLayer = (LossLayer *)
                        CoreML::Specification::NeuralNetwork::mutable_updateparams(local_128);
            ceLossLayer = (CategoricalCrossEntropyLossLayer *)
                          CoreML::Specification::NetworkUpdateParameters::add_losslayers
                                    ((NetworkUpdateParameters *)lossLayer);
            pAVar4 = &((LossLayer *)ceLossLayer)->name_;
            pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                               ((MessageLite *)ceLossLayer);
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"cce_loss",pAVar5);
            trainingInput =
                 (FeatureDescription *)
                 CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                           ((LossLayer *)ceLossLayer);
            pAVar4 = &trainingInput->name_;
            pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                               ((MessageLite *)trainingInput);
            google::protobuf::internal::ArenaStringPtr::Set(pAVar4,local_218,pAVar5);
            pAVar4 = &trainingInput->shortdescription_;
            pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                               (&trainingInput->super_MessageLite);
            google::protobuf::internal::ArenaStringPtr::Set(pAVar4,local_240,pAVar5);
            this_00 = CoreML::Specification::Model::mutable_description(m4);
            this_01 = CoreML::Specification::ModelDescription::mutable_traininginput(this_00);
            trainingInputTensorShape =
                 (ArrayFeatureType *)
                 google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                           (this_01);
            pRVar6 = &trainingInputTensorShape->shape_;
            pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                               ((MessageLite *)trainingInputTensorShape);
            google::protobuf::internal::ArenaStringPtr::Set
                      ((ArenaStringPtr *)pRVar6,local_240,pAVar5);
            this_02 = CoreML::Specification::FeatureDescription::mutable_type
                                ((FeatureDescription *)trainingInputTensorShape);
            local_270 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_02);
            CoreML::Specification::ArrayFeatureType::set_datatype
                      (local_270,ArrayFeatureType_ArrayDataType_INT32);
            CoreML::Specification::ArrayFeatureType::add_shape(local_270,1);
            addLearningRate<CoreML::Specification::NeuralNetwork>
                      (local_128,kSgdOptimizer,0.699999988079071,0.0,1.0);
            pNVar1 = local_128;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            local_2a8._M_t._M_impl._0_8_ = 0;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_2a8);
            addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                      (pNVar1,kSgdOptimizer,10,5,100,&local_2a8);
            std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_2a8);
            pNVar1 = local_128;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            local_2d8._M_t._M_impl._0_8_ = 0;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2d8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_2d8);
            addEpochs<CoreML::Specification::NeuralNetwork>(pNVar1,100,1,100,&local_2d8);
            std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_2d8);
            pNVar1 = local_128;
            local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            local_308._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            local_308._M_t._M_impl._0_8_ = 0;
            local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_308._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_308);
            addShuffleAndSeed<CoreML::Specification::NeuralNetwork>(pNVar1,0x7e3,0,0x7e3,&local_308)
            ;
            std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_308);
            CoreML::Model::validate(&local_330,m4);
            CoreML::Result::operator=((Result *)local_a8,&local_330);
            CoreML::Result::~Result(&local_330);
            bVar2 = CoreML::Result::good((Result *)local_a8);
            if (!bVar2) {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9a9);
              poVar3 = std::operator<<(poVar3,": error: ");
              poVar3 = std::operator<<(poVar3,"(res).good()");
              poVar3 = std::operator<<(poVar3," was false, expected true.");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
            spec._oneof_case_[0]._1_3_ = 0;
            spec._oneof_case_[0]._0_1_ = !bVar2;
            local_154 = 1;
            std::__cxx11::string::~string(local_240);
            std::__cxx11::string::~string(local_218);
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98a);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(res).good()");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          spec._oneof_case_[0] = 1;
          local_154 = 1;
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x984);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(res).good()");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
      local_154 = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x981);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(res).good()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
    local_154 = 1;
  }
  CoreML::Result::~Result((Result *)local_a8);
  CoreML::Specification::Model::~Model((Model *)((long)&res.m_message.field_2 + 8));
  return spec._oneof_case_[0];
}

Assistant:

int testValid_Pipeline() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    auto neuralNet = buildBasicNeuralNetworkModel(*m3, true, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to pass!
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Add target to updatable neural network model (3rd) within pipeline
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(*m3, "softmax", tensorAttributesD.name, softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cce_loss");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = (*m3).mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    return 0;
}